

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningFVB
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,KFLOAT32 totalTimeSinceReset)

{
  float fVar1;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 *puVar7;
  WorldCoordinates *pWVar8;
  KUINT16 i;
  long lVar9;
  undefined1 *puVar10;
  KUINT16 j;
  long lVar11;
  Vector *this_00;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> m;
  TMATRIX R2Matrix;
  TMATRIX IR2Matrix;
  Vector local_100;
  double local_e8;
  double local_e0;
  WorldCoordinates local_d8;
  float local_b8;
  undefined1 local_a8 [16];
  KFLOAT64 local_98;
  KFLOAT64 KStack_90;
  float local_88;
  undefined1 local_78 [16];
  Vector local_60;
  undefined1 local_44 [36];
  
  calcDeadReckoningFPB(this,PositionOut,totalTimeSinceReset);
  fVar1 = (float)this->m_f64Magnitude;
  fVar12 = fVar1 * (float)totalTimeSinceReset;
  __x = (double)fVar12;
  if (__x <= 1e-05) {
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_100,&this->m_initOrientationMatrixTranspose,&this->m_Ab);
    DATA_TYPE::Vector::operator*((Vector *)&local_d8,&local_100,totalTimeSinceReset);
    DATA_TYPE::WorldCoordinates::operator+
              ((WorldCoordinates *)local_a8,PositionOut,(Vector *)&local_d8);
    PositionOut->m_f64Z = KStack_90;
    PositionOut->m_f64X = (KFLOAT64)local_a8._8_8_;
    PositionOut->m_f64Y = local_98;
    DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)local_a8);
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_d8.super_DataTypeBase);
    this_00 = &local_100;
  }
  else {
    fVar13 = fVar1 * fVar1 * fVar1;
    dVar2 = cos(__x);
    dVar3 = sin(__x);
    local_78._8_4_ = 0;
    local_78._0_8_ = -__x;
    local_78._12_4_ = 0x80000000;
    local_e0 = (double)(fVar1 * fVar13);
    dVar4 = cos(__x);
    dVar5 = sin(__x);
    local_e8 = sin(__x);
    dVar6 = cos(__x);
    local_88 = (this->m_wwMatrix).Data[2][2];
    local_98 = *(KFLOAT64 *)((this->m_wwMatrix).Data[1] + 1);
    KStack_90 = *(KFLOAT64 *)(this->m_wwMatrix).Data[2];
    local_a8._0_8_ = *(_func_int ***)(this->m_wwMatrix).Data[0];
    local_a8._8_8_ = *(KFLOAT64 *)((this->m_wwMatrix).Data[0] + 2);
    puVar7 = local_44;
    lVar9 = 0;
    do {
      lVar11 = 0;
      do {
        uVar14 = 0x3f800000;
        if (lVar9 != lVar11) {
          uVar14 = 0;
        }
        *(undefined4 *)(puVar7 + lVar11 * 4) = uVar14;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar9 = lVar9 + 1;
      puVar7 = puVar7 + 0xc;
    } while (lVar9 != 3);
    dVar6 = (double)local_78._0_8_ * dVar6;
    puVar7 = local_a8;
    lVar9 = 0;
    do {
      lVar11 = 0;
      do {
        *(float *)(puVar7 + lVar11 * 4) =
             (float)((double)*(float *)(puVar7 + lVar11 * 4) *
                    (((((double)(fVar12 * fVar12) * 0.5 - dVar2) - dVar3 * __x) + 1.0) / local_e0));
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar9 = lVar9 + 1;
      puVar7 = puVar7 + 0xc;
    } while (lVar9 != 3);
    puVar7 = local_44;
    lVar9 = 0;
    do {
      lVar11 = 0;
      do {
        *(float *)(puVar7 + lVar11 * 4) =
             (float)((double)*(float *)(puVar7 + lVar11 * 4) *
                    ((dVar5 * __x + dVar4 + -1.0) / (double)(fVar1 * fVar1)));
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar9 = lVar9 + 1;
      puVar7 = puVar7 + 0xc;
    } while (lVar9 != 3);
    pWVar8 = &local_d8;
    local_b8 = (this->m_SkewOmegaMatrix).Data[2][2];
    local_d8.m_f64Y = *(KFLOAT64 *)((this->m_SkewOmegaMatrix).Data[1] + 1);
    local_d8.m_f64Z = *(KFLOAT64 *)(this->m_SkewOmegaMatrix).Data[2];
    local_d8.super_DataTypeBase._vptr_DataTypeBase =
         *(_func_int ***)(this->m_SkewOmegaMatrix).Data[0];
    local_d8.m_f64X = *(KFLOAT64 *)((this->m_SkewOmegaMatrix).Data[0] + 2);
    lVar9 = 0;
    do {
      lVar11 = 0;
      do {
        *(float *)((long)&(pWVar8->super_DataTypeBase)._vptr_DataTypeBase + lVar11 * 4) =
             (float)((double)*(float *)((long)&(pWVar8->super_DataTypeBase)._vptr_DataTypeBase +
                                       lVar11 * 4) * ((dVar6 + local_e8) / (double)fVar13));
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar9 = lVar9 + 1;
      pWVar8 = (WorldCoordinates *)((long)&pWVar8->m_f64X + 4);
    } while (lVar9 != 3);
    puVar7 = local_44;
    pWVar8 = &local_d8;
    lVar9 = 0;
    do {
      lVar11 = 0;
      do {
        *(float *)(puVar7 + lVar11 * 4) =
             *(float *)((long)&(pWVar8->super_DataTypeBase)._vptr_DataTypeBase + lVar11 * 4) +
             *(float *)(puVar7 + lVar11 * 4);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar9 = lVar9 + 1;
      puVar7 = puVar7 + 0xc;
      pWVar8 = (WorldCoordinates *)((long)&pWVar8->m_f64X + 4);
    } while (lVar9 != 3);
    puVar7 = local_a8;
    puVar10 = local_44;
    lVar9 = 0;
    do {
      lVar11 = 0;
      do {
        *(float *)(puVar7 + lVar11 * 4) =
             *(float *)(puVar10 + lVar11 * 4) + *(float *)(puVar7 + lVar11 * 4);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar9 = lVar9 + 1;
      puVar7 = puVar7 + 0xc;
      puVar10 = puVar10 + 0xc;
    } while (lVar9 != 3);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_60,(Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)local_a8,
               &this->m_Ab);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_100,&this->m_initOrientationMatrixTranspose,&local_60);
    DATA_TYPE::WorldCoordinates::operator+(&local_d8,PositionOut,&local_100);
    PositionOut->m_f64Z = local_d8.m_f64Z;
    PositionOut->m_f64X = local_d8.m_f64X;
    PositionOut->m_f64Y = local_d8.m_f64Y;
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_d8.super_DataTypeBase);
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_100.super_DataTypeBase);
    this_00 = &local_60;
  }
  DATA_TYPE::DataTypeBase::~DataTypeBase(&this_00->super_DataTypeBase);
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningFVB( WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset )
{
    // the first part of the equation
    calcDeadReckoningFPB( PositionOut, totalTimeSinceReset);

    // now adding to the position R0t_w->b * R2 * Ab
    // Calculate Magnitude, scalars etc
    const KFLOAT64 f64DeltaMag = totalTimeSinceReset * m_f64Magnitude;

    if( f64DeltaMag > MAGIC_EPSILON )
    {

        KFLOAT32 m_f32MagPow2 = m_f64Magnitude * m_f64Magnitude;
        KFLOAT32 m_f32MagPow3 = m_f32MagPow2 * m_f64Magnitude;
        KFLOAT32 m_f32MagPow4 = m_f32MagPow3 * m_f64Magnitude;
        KFLOAT32 m_f32DeltaPow2 = f64DeltaMag * f64DeltaMag;

        KFLOAT64 f64R2Scale = (0.5 * m_f32DeltaPow2 - cos( f64DeltaMag )- f64DeltaMag * sin( f64DeltaMag ) + 1)/m_f32MagPow4;

        KFLOAT64 f64R2IScalar = ( cos( f64DeltaMag ) + f64DeltaMag * sin( f64DeltaMag ) - 1.0 ) / m_f32MagPow2;

        KFLOAT64 f64R2SkewScale = ( sin( f64DeltaMag ) - f64DeltaMag * cos( f64DeltaMag ) ) / m_f32MagPow3;

        // Create the ww matrix
        TMATRIX R2Matrix( m_wwMatrix ), IR2Matrix;
        R2Matrix *= f64R2Scale;
        IR2Matrix *= f64R2IScalar;
        R2Matrix += ( IR2Matrix + ( m_SkewOmegaMatrix * f64R2SkewScale ) );

        PositionOut = PositionOut + ( m_initOrientationMatrixTranspose * ( R2Matrix * m_Ab ) );
    } else
        PositionOut = PositionOut + ( m_initOrientationMatrixTranspose * m_Ab ) * totalTimeSinceReset;
}